

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.h
# Opt level: O3

void __thiscall sptk::MedianFilter::~MedianFilter(MedianFilter *this)

{
  pointer pdVar1;
  
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__MedianFilter_00110c40;
  std::
  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~deque(&this->queue_);
  pdVar1 = (this->flat_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->buffer_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

~MedianFilter() override {
  }